

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterLoadRowid(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  Fts5Data *pFVar2;
  int iVar3;
  
  pFVar2 = pIter->pLeaf;
  iVar3 = pIter->iLeafOffset;
  if (pFVar2->szLeaf <= iVar3) {
    fts5SegIterNextPage(p,pIter);
    pFVar2 = pIter->pLeaf;
    iVar3 = 4;
    if (pFVar2 == (Fts5Data *)0x0) {
      if (p->rc != 0) {
        return;
      }
      p->rc = 0x10b;
      return;
    }
  }
  bVar1 = sqlite3Fts5GetVarint(pFVar2->p + iVar3,(u64 *)&pIter->iRowid);
  pIter->iLeafOffset = iVar3 + (uint)bVar1;
  return;
}

Assistant:

static void fts5SegIterLoadRowid(Fts5Index *p, Fts5SegIter *pIter){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  int iOff = pIter->iLeafOffset;

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  if( iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( pIter->pLeaf==0 ){
      if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
      return;
    }
    iOff = 4;
    a = pIter->pLeaf->p;
  }
  iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&pIter->iRowid);
  pIter->iLeafOffset = iOff;
}